

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

double __thiscall cnn::expr::pow(expr *this,double __x,double __y)

{
  initializer_list<cnn::VariableIndex> *arguments;
  long in_RDX;
  undefined8 *in_RSI;
  double extraout_XMM0_Qa;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined8 local_18;
  
  local_20 = (undefined1 *)&local_28;
  arguments = (initializer_list<cnn::VariableIndex> *)*in_RSI;
  local_28 = *(undefined4 *)(in_RSI + 1);
  local_24 = *(undefined4 *)(in_RDX + 8);
  local_18 = 2;
  ComputationGraph::add_function<cnn::Pow>((ComputationGraph *)(this + 8),arguments);
  *(initializer_list<cnn::VariableIndex> **)this = arguments;
  return extraout_XMM0_Qa;
}

Assistant:

Expression pow(const Expression& x, const Expression& y) { return Expression(x.pg, x.pg->add_function<Pow>({x.i, y.i})); }